

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

bool __thiscall lsh::vector::get(vector *this,uint i)

{
  uint uVar1;
  out_of_range *this_00;
  uint uVar2;
  
  uVar1 = this->size_;
  if (i < uVar1) {
    uVar2 = 0;
    if (uVar1 < 0x20) {
      uVar2 = uVar1;
    }
    return (*(this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start >> (~i + uVar2 & 0x1f) & 1) != 0;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Invalid index");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

bool vector::get(unsigned int i) const {
    unsigned int s = this->size_;
    unsigned int c = this->chunk_size_;

    if (i >= s) {
      throw std::out_of_range("Invalid index");
    }

    // Compute the index of the target chunk.
    unsigned int d = i / s;

    // Compute the index of the first bit of the target chunk.
    unsigned int j = d * s;

    // Compute the number of bits in the target chunk.
    unsigned int b = j + c > s ? s - j : c;

    return (this->components_[d] >> (b - (i % s) - 1)) & 1;
  }